

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<bool,_allocator_default<bool>_>::alloc
          (array<bool,_allocator_default<bool>_> *this,int new_len)

{
  bool *pbVar1;
  bool *pbVar2;
  ulong uVar3;
  
  this->list_size = new_len;
  pbVar2 = (bool *)operator_new__((long)new_len);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pbVar1 = this->list;
  if (new_len < 1) {
    if (pbVar1 == (bool *)0x0) goto LAB_0013ab25;
  }
  else {
    uVar3 = 0;
    do {
      pbVar2[uVar3] = pbVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)new_len != uVar3);
  }
  operator_delete__(pbVar1);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_0013ab25:
  this->num_elements = new_len;
  this->list = pbVar2;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}